

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_>::
Impl<0UL,_false>::insert
          (Impl<0UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  void *in_RAX;
  undefined4 extraout_var;
  ulong uVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  ulong uVar5;
  Maybe<unsigned_long> MVar6;
  Iterator iter;
  char *local_80;
  size_t sStack_78;
  Iterator local_70;
  StringPtr *local_58;
  long local_50;
  SearchKey local_48;
  Tuple<kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *local_40;
  StringPtr **local_38;
  char **local_30;
  
  if (skip != 0) {
    local_40 = &table->indexes;
    local_58 = (table->rows).builder.ptr;
    local_50 = (long)(table->rows).builder.pos - (long)local_58 >> 4;
    local_80 = (row->content).ptr;
    sStack_78 = (row->content).size_;
    local_30 = &local_80;
    local_38 = &local_58;
    local_48._vptr_SearchKey = (_func_int **)&PTR_search_001b8a40;
    _::BTreeImpl::insert(&local_70,(BTreeImpl *)&(table->indexes).erasedCount,&local_48);
    uVar4 = (ulong)local_70.row;
    if (uVar4 == 0xe) {
      uVar4 = 0xe;
    }
    else {
      uVar1 = (local_70.leaf)->rows[uVar4].i;
      if (uVar1 != 0) {
        uVar5 = (ulong)(uVar1 - 1);
        sVar2 = local_58[uVar5].content.size_;
        if (sVar2 == sStack_78) {
          iVar3 = bcmp(local_58[uVar5].content.ptr,local_80,sVar2 - 1);
          in_RAX = (void *)CONCAT44(extraout_var,iVar3);
          if (iVar3 == 0) {
            *this = (Impl<0UL,_false>)0x1;
            *(ulong *)(this + 8) = uVar5;
            pos = (size_t)extraout_RDX;
            goto LAB_0014bc32;
          }
        }
      }
    }
    in_RAX = memmove((local_70.leaf)->rows + uVar4 + 1,(local_70.leaf)->rows + uVar4,
                     (ulong)(local_70.row + 1) * -4 + 0x38);
    (local_70.leaf)->rows[uVar4].i = (int)pos + 1;
    pos = (size_t)extraout_RDX_00;
  }
  *this = (Impl<0UL,_false>)0x0;
LAB_0014bc32:
  MVar6.ptr.field_1.value = pos;
  MVar6.ptr._0_8_ = in_RAX;
  return (Maybe<unsigned_long>)MVar6.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_MAYBE(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return *existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == nullptr;
    return result;
  }